

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receive_buffer.cpp
# Opt level: O2

span<char> __thiscall
libtorrent::aux::crypto_receive_buffer::mutable_buffer(crypto_receive_buffer *this,int bytes)

{
  receive_buffer *this_00;
  span<char> sVar1;
  
  this_00 = this->m_connection_buffer;
  if (this->m_recv_pos != 0x7fffffff) {
    sVar1 = receive_buffer::mutable_buffer(this_00,this_00->m_packet_size - this->m_recv_pos);
    return sVar1;
  }
  sVar1.m_len = (long)bytes;
  sVar1.m_ptr = (this_00->m_recv_buffer).m_begin +
                ((this_00->m_recv_start - bytes) + this_00->m_recv_pos);
  return sVar1;
}

Assistant:

span<char> crypto_receive_buffer::mutable_buffer(
	int const bytes)
{
	int const pending_decryption = (m_recv_pos != INT_MAX)
		? m_connection_buffer.packet_size() - m_recv_pos
		: bytes;
	return m_connection_buffer.mutable_buffer(pending_decryption);
}